

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall QDockAreaLayoutInfo::reparentWidgets(QDockAreaLayoutInfo *this,QWidget *parent)

{
  uint uVar1;
  QDockAreaLayoutItem *pQVar2;
  QDockAreaLayoutInfo *this_00;
  long *plVar3;
  QWidget *this_01;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if (&this->tabBar->super_QWidget != (QWidget *)0x0) {
    QWidget::setParent(&this->tabBar->super_QWidget,parent);
  }
  if ((this->item_list).d.size != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pQVar2 = (this->item_list).d.ptr;
      if ((*(byte *)((long)&pQVar2->flags + lVar6) & 1) == 0) {
        this_00 = *(QDockAreaLayoutInfo **)((long)&pQVar2->subinfo + lVar6);
        if (this_00 != (QDockAreaLayoutInfo *)0x0) {
          reparentWidgets(this_00,parent);
        }
        plVar3 = *(long **)((long)&pQVar2->widgetItem + lVar6);
        if (plVar3 != (long *)0x0) {
          this_01 = (QWidget *)(**(code **)(*plVar3 + 0x68))();
          lVar4 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
          if (((lVar4 == 0) && (*(QWidget **)(*(long *)&this_01->field_0x8 + 0x10) != parent)) &&
             (uVar1 = this_01->data->widget_attributes,
             QWidget::setParent(this_01,parent,
                                (WindowFlags)
                                (this_01->data->window_flags).
                                super_QFlagsStorageHelper<Qt::WindowType,_4>.
                                super_QFlagsStorage<Qt::WindowType>.i), (uVar1 >> 0x10 & 1) == 0)) {
            QWidget::show(this_01);
          }
        }
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x28;
    } while (uVar5 < (ulong)(this->item_list).d.size);
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::reparentWidgets(QWidget *parent)
{
    if (tabBar)
        tabBar->setParent(parent);

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.flags & QDockAreaLayoutItem::GapItem)
            continue;
        if (item.subinfo)
            item.subinfo->reparentWidgets(parent);
        if (item.widgetItem) {
            QWidget *w = item.widgetItem->widget();
            if (qobject_cast<QDockWidgetGroupWindow *>(w))
                continue;
            if (w->parent() != parent) {
                bool hidden = w->isHidden();
                w->setParent(parent, w->windowFlags());
                if (!hidden)
                    w->show();
            }
        }
    }
}